

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_asn1.cc
# Opt level: O0

int RSA_marshal_public_key(CBB *cbb,RSA *rsa)

{
  int iVar1;
  undefined1 local_50 [8];
  CBB child;
  RSA *rsa_local;
  CBB *cbb_local;
  
  child.u._24_8_ = rsa;
  iVar1 = CBB_add_asn1(cbb,(CBB *)local_50,0x20000010);
  if ((((iVar1 != 0) &&
       (iVar1 = marshal_integer((CBB *)local_50,*(BIGNUM **)(child.u._24_8_ + 8)), iVar1 != 0)) &&
      (iVar1 = marshal_integer((CBB *)local_50,*(BIGNUM **)(child.u._24_8_ + 0x10)), iVar1 != 0)) &&
     (iVar1 = CBB_flush(cbb), iVar1 != 0)) {
    return 1;
  }
  ERR_put_error(4,0,0x79,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_asn1.cc"
                ,0x5b);
  return 0;
}

Assistant:

int RSA_marshal_public_key(CBB *cbb, const RSA *rsa) {
  CBB child;
  if (!CBB_add_asn1(cbb, &child, CBS_ASN1_SEQUENCE) ||
      !marshal_integer(&child, rsa->n) ||
      !marshal_integer(&child, rsa->e) ||
      !CBB_flush(cbb)) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_ENCODE_ERROR);
    return 0;
  }
  return 1;
}